

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O0

int x509_check_issued_with_callback(X509_STORE_CTX *ctx,X509 *x,X509 *issuer)

{
  int iVar1;
  int ret;
  X509 *issuer_local;
  X509 *x_local;
  X509_STORE_CTX *ctx_local;
  
  iVar1 = X509_check_issued((X509 *)issuer,(X509 *)x);
  if (iVar1 == 0) {
    ctx_local._4_4_ = 1;
  }
  else if ((ctx->param->flags & 1) == 0) {
    ctx_local._4_4_ = 0;
  }
  else {
    ctx->error = iVar1;
    ctx->current_cert = x;
    ctx_local._4_4_ = call_verify_cb(0,ctx);
  }
  return ctx_local._4_4_;
}

Assistant:

int x509_check_issued_with_callback(X509_STORE_CTX *ctx, X509 *x,
                                    X509 *issuer) {
  int ret;
  ret = X509_check_issued(issuer, x);
  if (ret == X509_V_OK) {
    return 1;
  }
  // If we haven't asked for issuer errors don't set ctx
  if (!(ctx->param->flags & X509_V_FLAG_CB_ISSUER_CHECK)) {
    return 0;
  }

  ctx->error = ret;
  ctx->current_cert = x;
  return call_verify_cb(0, ctx);
}